

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Transmitter_PDU::Encode(Transmitter_PDU *this,KDataStream *stream)

{
  KOCTET *pKVar1;
  
  Radio_Communications_Header::Encode(&this->super_Radio_Communications_Header,stream);
  (*(this->m_RadioEntityType).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_RadioEntityType,stream);
  KDataStream::Write(stream,this->m_ui8TransmitterState);
  KDataStream::Write(stream,this->m_ui8InputSource);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  (*(this->m_AntennaLocation).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AntennaLocation,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16AntennaPatternType);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16AntennaPatternLength);
  KDataStream::Write<unsigned_long_long>(stream,this->m_ui64Freq);
  KDataStream::Write<float>(stream,(float)this->m_f32TransmitFreqBW);
  KDataStream::Write<float>(stream,(float)this->m_f32Power);
  (*(this->m_ModulationType).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ModulationType,stream);
  (*(this->m_CryptoSystem).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_CryptoSystem,stream);
  KDataStream::Write(stream,this->m_ui8LengthOfModulationParam);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding2);
  KDataStream::Write(stream,this->m_ui8Padding3);
  for (pKVar1 = (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pKVar1 != (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish; pKVar1 = pKVar1 + 1) {
    KDataStream::Write(stream,*pKVar1);
  }
  for (pKVar1 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pKVar1 != (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish; pKVar1 = pKVar1 + 1) {
    KDataStream::Write(stream,*pKVar1);
  }
  return;
}

Assistant:

void Transmitter_PDU::Encode( KDataStream & stream ) const
{
    Radio_Communications_Header::Encode( stream );

    stream << KDIS_STREAM m_RadioEntityType
           << m_ui8TransmitterState
           << m_ui8InputSource
           << m_ui16Padding1
           << KDIS_STREAM m_AntennaLocation
           << m_ui16AntennaPatternType
           << m_ui16AntennaPatternLength
           << m_ui64Freq
           << m_f32TransmitFreqBW
           << m_f32Power
           << KDIS_STREAM m_ModulationType
           << KDIS_STREAM m_CryptoSystem
           << m_ui8LengthOfModulationParam
           << m_ui16Padding2
           << m_ui8Padding3;

    vector<KOCTET>::const_iterator citrModulation = m_vModulationParams.begin();

    for( ; citrModulation != m_vModulationParams.end(); ++citrModulation )
    {
        stream << *citrModulation;
    }

    vector<KOCTET>::const_iterator citrAntenna = m_vAntennaPattern.begin();

    for( ; citrAntenna != m_vAntennaPattern.end(); ++citrAntenna )
    {
        stream << *citrAntenna;
    }
}